

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

bool __thiscall
kj::anon_unknown_9::DiskDirectory::trySymlink
          (DiskDirectory *this,PathPtr linkpath,StringPtr content,WriteMode mode)

{
  bool bVar1;
  Function<int_(kj::StringPtr)> local_48;
  _func_int *local_38;
  size_t local_30;
  
  local_30 = content.content.size_;
  local_38 = (_func_int *)content.content.ptr;
  local_48.impl.ptr = (Iface *)operator_new(0x18);
  (local_48.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00262b88;
  local_48.impl.ptr[1]._vptr_Iface = &local_38;
  local_48.impl.ptr[2]._vptr_Iface = (_func_int **)&this->super_DiskHandle;
  local_48.impl.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::trySymlink(kj::PathPtr,kj::StringPtr,kj::WriteMode)const::{lambda(kj::StringPtr)#1}>>
        ::instance;
  bVar1 = DiskHandle::tryReplaceNode(&this->super_DiskHandle,linkpath,mode,&local_48);
  if (local_48.impl.ptr != (Iface *)0x0) {
    (**(local_48.impl.disposer)->_vptr_Disposer)
              (local_48.impl.disposer,
               (local_48.impl.ptr)->_vptr_Iface[-2] + (long)&(local_48.impl.ptr)->_vptr_Iface);
  }
  return bVar1;
}

Assistant:

bool trySymlink(PathPtr linkpath, StringPtr content, WriteMode mode) const override {
    return DiskHandle::trySymlink(linkpath, content, mode);
  }